

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

OPTIONHANDLER_HANDLE amqp_device_retrieve_options(AMQP_DEVICE_HANDLE handle)

{
  OPTIONHANDLER_RESULT OVar1;
  LOGGER_LOG p_Var2;
  OPTIONHANDLER_HANDLE handle_00;
  OPTIONHANDLER_HANDLE value;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  OPTIONHANDLER_HANDLE dependency_options;
  AMQP_DEVICE_INSTANCE_conflict *instance;
  LOGGER_LOG l_1;
  OPTIONHANDLER_HANDLE options;
  LOGGER_LOG l;
  OPTIONHANDLER_HANDLE result;
  AMQP_DEVICE_HANDLE handle_local;
  
  if (handle == (AMQP_DEVICE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"amqp_device_retrieve_options",0x5bd,1,
                "Failed to retrieve options from device instance (handle is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    handle_00 = OptionHandler_Create
                          (device_clone_option,device_destroy_option,amqp_device_set_option);
    if (handle_00 == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                  ,"amqp_device_retrieve_options",0x5c6,1,
                  "Failed to retrieve options from device instance (OptionHandler_Create failed)");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      l_2 = (LOGGER_LOG)0x0;
      if ((handle->authentication_handle == (AUTHENTICATION_HANDLE)0x0) ||
         (l_2 = (LOGGER_LOG)authentication_retrieve_options(handle->authentication_handle),
         (OPTIONHANDLER_HANDLE)l_2 != (OPTIONHANDLER_HANDLE)0x0)) {
        if ((handle->authentication_handle == (AUTHENTICATION_HANDLE)0x0) ||
           (OVar1 = OptionHandler_AddOption(handle_00,DEVICE_OPTION_SAVED_AUTH_OPTIONS,l_2),
           OVar1 == OPTIONHANDLER_OK)) {
          value = telemetry_messenger_retrieve_options(handle->messenger_handle);
          if (value == (OPTIONHANDLER_HANDLE)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                        ,"amqp_device_retrieve_options",0x5dd,1,
                        "Failed to retrieve options from device \'%s\' (failed to retrieve options from messenger instance)"
                        ,handle->config->device_id);
            }
            l = (LOGGER_LOG)0x0;
          }
          else {
            OVar1 = OptionHandler_AddOption(handle_00,DEVICE_OPTION_SAVED_MESSENGER_OPTIONS,value);
            l = (LOGGER_LOG)handle_00;
            if (OVar1 != OPTIONHANDLER_OK) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                          ,"amqp_device_retrieve_options",0x5e2,1,
                          "Failed to retrieve options from device \'%s\' (OptionHandler_AddOption failed for option \'%s\')"
                          ,handle->config->device_id,DEVICE_OPTION_SAVED_MESSENGER_OPTIONS);
              }
              l = (LOGGER_LOG)0x0;
            }
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                      ,"amqp_device_retrieve_options",0x5d8,1,
                      "Failed to retrieve options from device \'%s\' (OptionHandler_AddOption failed for option \'%s\')"
                      ,handle->config->device_id,DEVICE_OPTION_SAVED_AUTH_OPTIONS);
          }
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                    ,"amqp_device_retrieve_options",0x5d2,1,
                    "Failed to retrieve options from device \'%s\' (failed to retrieve options from authentication instance)"
                    ,handle->config->device_id);
        }
        l = (LOGGER_LOG)0x0;
      }
      if (l == (LOGGER_LOG)0x0) {
        OptionHandler_Destroy(handle_00);
      }
    }
  }
  return (OPTIONHANDLER_HANDLE)l;
}

Assistant:

OPTIONHANDLER_HANDLE amqp_device_retrieve_options(AMQP_DEVICE_HANDLE handle)
{
    OPTIONHANDLER_HANDLE result;

    if (handle == NULL)
    {
        LogError("Failed to retrieve options from device instance (handle is NULL)");
        result = NULL;
    }
    else
    {
        OPTIONHANDLER_HANDLE options = OptionHandler_Create(device_clone_option, device_destroy_option, (pfSetOption)amqp_device_set_option);

        if (options == NULL)
        {
            LogError("Failed to retrieve options from device instance (OptionHandler_Create failed)");
            result = NULL;
        }
        else
        {
            AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)handle;

            OPTIONHANDLER_HANDLE dependency_options = NULL;

            if (instance->authentication_handle != NULL &&
                (dependency_options = authentication_retrieve_options(instance->authentication_handle)) == NULL)
            {
                LogError("Failed to retrieve options from device '%s' (failed to retrieve options from authentication instance)", instance->config->device_id);
                result = NULL;
            }
            else if (instance->authentication_handle != NULL &&
                OptionHandler_AddOption(options, DEVICE_OPTION_SAVED_AUTH_OPTIONS, (const void*)dependency_options) != OPTIONHANDLER_OK)
            {
                LogError("Failed to retrieve options from device '%s' (OptionHandler_AddOption failed for option '%s')", instance->config->device_id, DEVICE_OPTION_SAVED_AUTH_OPTIONS);
                result = NULL;
            }
            else if ((dependency_options = telemetry_messenger_retrieve_options(instance->messenger_handle)) == NULL)
            {
                LogError("Failed to retrieve options from device '%s' (failed to retrieve options from messenger instance)", instance->config->device_id);
                result = NULL;
            }
            else if (OptionHandler_AddOption(options, DEVICE_OPTION_SAVED_MESSENGER_OPTIONS, (const void*)dependency_options) != OPTIONHANDLER_OK)
            {
                LogError("Failed to retrieve options from device '%s' (OptionHandler_AddOption failed for option '%s')", instance->config->device_id, DEVICE_OPTION_SAVED_MESSENGER_OPTIONS);
                result = NULL;
            }
            else
            {
                result = options;
            }

            if (result == NULL)
            {
                OptionHandler_Destroy(options);
            }
        }
    }

    return result;
}